

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Fire_PDU::Decode(Fire_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  Descriptor *pDVar3;
  MunitionDescriptor *pMVar4;
  int iVar5;
  long local_d8;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_a0;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_88;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_70;
  undefined1 local_55;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Fire_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar5 = 0;
  if ((local_19 & 1) != 0) {
    iVar5 = 0xc;
  }
  if ((uint)KVar1 + iVar5 < 0x60) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Warfare_Header::Decode(&this->super_Warfare_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&this->m_ui32FireMissionIndex);
  DATA_TYPE::operator>>(pKVar2,&(this->m_Location).super_DataTypeBase);
  if ((this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion < 7) {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
    if (pDVar3 == (Descriptor *)0x0) {
      pMVar4 = (MunitionDescriptor *)operator_new(0x20);
      DATA_TYPE::MunitionDescriptor::MunitionDescriptor(pMVar4);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_70,(Descriptor *)pMVar4);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,&local_70);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_70);
    }
  }
  else if (((this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 1) == 0) {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
    if (pDVar3 != (Descriptor *)0x0) {
      pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
      if (pDVar3 == (Descriptor *)0x0) {
        local_d8 = 0;
      }
      else {
        local_d8 = __dynamic_cast(pDVar3,&DATA_TYPE::Descriptor::typeinfo,
                                  &DATA_TYPE::MunitionDescriptor::typeinfo,0);
      }
      if (local_d8 != 0) goto LAB_001e38ee;
    }
    pMVar4 = (MunitionDescriptor *)operator_new(0x20);
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor(pMVar4);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_88,(Descriptor *)pMVar4);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,&local_88);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_88);
  }
  else {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
    if ((pDVar3 == (Descriptor *)0x0) ||
       (pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor),
       pDVar3 == (Descriptor *)0x0)) {
      pDVar3 = (Descriptor *)operator_new(0x18);
      DATA_TYPE::Descriptor::Descriptor(pDVar3);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_a0,pDVar3);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,&local_a0);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_a0);
    }
  }
LAB_001e38ee:
  pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator->(&this->m_pDescriptor);
  (*(pDVar3->super_DataTypeBase)._vptr_DataTypeBase[3])(pDVar3,pKStack_18);
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,&(this->m_Velocity).super_DataTypeBase);
  KDataStream::operator>>(pKVar2,(float *)&this->m_f32Range);
  return;
}

Assistant:

void Fire_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < FIRE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Warfare_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32FireMissionIndex
           >> KDIS_STREAM m_Location;

    #if DIS_VERSION < 7

    if( !m_pDescriptor.GetPtr() )
    {
        m_pDescriptor = DescPtr( new MunitionDescriptor() );
    }

    #else

    // If the protocol version is not 7 then treat it as a MunitionDesc
    if( m_ui8ProtocolVersion < 7 )
    {
        if( !m_pDescriptor.GetPtr() )
        {
            m_pDescriptor = DescPtr( new MunitionDescriptor() );
        }
    }
    else // DIS 7
    {
        if( m_PDUStatusUnion.m_ui8PDUStatusFTI == MunitionFTI )
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new MunitionDescriptor() );
            }
        }
        else
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExpendableDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExpendableDescriptor() );
            }
        }
    }
    #endif

    m_pDescriptor->Decode( stream );

    stream >> KDIS_STREAM m_Velocity
           >> m_f32Range;
}